

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int64_t roaring_bitmap_get_index(roaring_bitmap_t *bm,uint32_t x)

{
  ushort uVar1;
  ushort uVar2;
  int32_t iVar3;
  int iVar4;
  undefined4 in_ESI;
  int *in_RDI;
  int32_t low_idx;
  uint32_t key;
  int i;
  int32_t high_idx;
  uint16_t xhigh;
  int64_t index;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_2c;
  long local_20;
  int64_t local_8;
  
  local_20 = 0;
  uVar2 = (ushort)((uint)in_ESI >> 0x10);
  iVar3 = ra_get_index((roaring_array_t *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  if (iVar3 < 0) {
    local_8 = -1;
  }
  else {
    for (local_2c = 0; local_2c < *in_RDI; local_2c = local_2c + 1) {
      uVar1 = *(ushort *)(*(long *)(in_RDI + 4) + (long)local_2c * 2);
      if (uVar2 <= uVar1) {
        if (uVar2 != uVar1) {
          return -1;
        }
        iVar4 = container_get_index((container_t *)
                                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                    '\0',0);
        if (iVar4 < 0) {
          return -1;
        }
        return local_20 + iVar4;
      }
      iVar4 = container_get_cardinality
                        ((container_t *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),'\0');
      local_20 = iVar4 + local_20;
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

int64_t roaring_bitmap_get_index(const roaring_bitmap_t *bm, uint32_t x) {
    int64_t index = 0;
    const uint16_t xhigh = x >> 16;
    int32_t high_idx = ra_get_index(&bm->high_low_container, xhigh);
    if (high_idx < 0) return -1;

    for (int i = 0; i < bm->high_low_container.size; i++) {
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            index +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
        } else if (xhigh == key) {
            int32_t low_idx = container_get_index(
                bm->high_low_container.containers[high_idx],
                bm->high_low_container.typecodes[high_idx], x & 0xFFFF);
            if (low_idx < 0) return -1;
            return index + low_idx;
        } else {
            return -1;
        }
    }
    return index;
}